

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymul.hpp
# Opt level: O0

void polymul_internal::polynomial_multiplier<double,_1,_4,_4>::mul
               (double *dst,double *p1,double *p2)

{
  int local_28;
  int local_24;
  int j;
  int i;
  double *p2_local;
  double *p1_local;
  double *dst_local;
  
  for (local_24 = 0; local_24 < 5; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < 5; local_28 = local_28 + 1) {
      dst[local_24 + local_28] = p1[local_24] * p2[local_28] + dst[local_24 + local_28];
    }
  }
  return;
}

Assistant:

static void mul(numtype POLYMUL_RESTRICT dst[],
                  const numtype p1[],
                  const numtype p2[]) {
    for (int i = 0; i <= Ndeg1; i++)
      for (int j = 0; j <= Ndeg2; j++)
        dst[i + j] += p1[i] * p2[j];
  }